

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture_type.cpp
# Opt level: O1

ostream * operator<<(ostream *p_os,TextureType p_texture_type)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  
  switch(p_texture_type) {
  case SPECULAR:
    pcVar3 = "TextureType::SPECULAR";
    lVar2 = 0x15;
    goto LAB_0031742c;
  case DIFFUSE:
    pcVar3 = "TextureType::DIFFUSE";
    lVar2 = 0x14;
    goto LAB_0031742c;
  case NORMAL:
    pcVar3 = "TextureType::NORMAL";
    break;
  case HEIGHT:
    pcVar3 = "TextureType::HEIGHT";
    break;
  default:
    poVar1 = std::operator<<((ostream *)&std::cerr,"unhandled switch case ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1e);
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/src/enums/texture_type.cpp"
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    exit(1);
  }
  lVar2 = 0x13;
LAB_0031742c:
  std::__ostream_insert<char,std::char_traits<char>>(p_os,pcVar3,lVar2);
  return p_os;
}

Assistant:

std::ostream &operator<<(std::ostream &p_os, const TextureType p_texture_type)
{
    switch (p_texture_type)
    {
    case TextureType::DIFFUSE:
    {
        p_os << "TextureType::DIFFUSE";
        break;
    };
    case TextureType::HEIGHT:
    {
        p_os << "TextureType::HEIGHT";
        break;
    };
    case TextureType::NORMAL:
    {
        p_os << "TextureType::NORMAL";
        break;
    };
    case TextureType::SPECULAR:
    {
        p_os << "TextureType::SPECULAR";
        break;
    };
    default:
    {
        UNHANDLED_SWITCH_CASE(__LINE__, __FILE__);
    };
    };
    return p_os;
}